

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

long __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,long,duckdb::QuantileIndirect<long>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<long> *accessor)

{
  DataChunk *pDVar1;
  CURSOR *pCVar2;
  duckdb *pdVar3;
  long lVar4;
  bool bVar5;
  reference pvVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  long result_1;
  long local_58;
  string local_50;
  
  pCVar2 = accessor->data;
  uVar7 = (pCVar2->scan).current_row_index;
  bVar5 = (pCVar2->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar7 || bVar5) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (long *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
      uVar7 = (pCVar2->scan).current_row_index;
    }
    pdVar3 = (duckdb *)pCVar2->data[(uint)((int)lidx - (int)uVar7)];
    bVar5 = TryCast::Operation<long,long>((int64_t)pdVar3,&local_58,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar3,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (lidx < uVar7 || bVar5) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (long *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
      uVar7 = (pCVar2->scan).current_row_index;
    }
    pdVar3 = (duckdb *)pCVar2->data[(uint)((int)lidx - (int)uVar7)];
    bVar5 = TryCast::Operation<long,long>((int64_t)pdVar3,&local_58,false);
    lVar4 = local_58;
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar3,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    pCVar2 = accessor->data;
    uVar7 = (pCVar2->scan).current_row_index;
    if ((pCVar2->scan).next_row_index <= hidx || hidx < uVar7) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,hidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (long *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
      uVar7 = (pCVar2->scan).current_row_index;
    }
    pdVar3 = (duckdb *)pCVar2->data[(uint)((int)hidx - (int)uVar7)];
    bVar5 = TryCast::Operation<long,long>((int64_t)pdVar3,&local_58,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_50,pdVar3,auVar8._8_8_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_58 = (long)((double)(local_58 - lVar4) *
                      (this->RN -
                      (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                     (double)lVar4);
  }
  return local_58;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}